

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O3

void __thiscall
despot::RockSample::PrintObs(RockSample *this,State *state,OBS_TYPE observation,ostream *out)

{
  long lVar1;
  char *pcVar2;
  
  if (observation == 0) {
    pcVar2 = "Bad";
    lVar1 = 3;
  }
  else {
    if (observation == 1) {
      pcVar2 = "Good";
    }
    else {
      if (observation != 2) {
        return;
      }
      pcVar2 = "None";
    }
    lVar1 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void RockSample::PrintObs(const State& state, OBS_TYPE observation,
	ostream& out) const {
	switch (observation) {
	case E_NONE:
		out << "None" << endl;
		break;
	case E_GOOD:
		out << "Good" << endl;
		break;
	case E_BAD:
		out << "Bad" << endl;
		break;
	}
}